

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  Statement *pSVar2;
  Terminator *pTVar3;
  Statement **ppSVar4;
  undefined8 *puVar5;
  Statement *s;
  Statement *s_00;
  Statement *pSVar6;
  pool_ref<soul::heart::Variable> local_38;
  
  puVar5 = *(undefined8 **)((long)__child_stack + 0x20);
  puVar1 = *(undefined8 **)((long)__child_stack + 0x28);
  if (puVar5 != puVar1) {
    do {
      local_38.object = cloneVariable(this,(Variable *)*puVar5);
      std::
      vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
      ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                  *)(__fn + 0x20),&local_38);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  s_00 = *(Statement **)((long)__child_stack + 0x38);
  if (s_00 != (Statement *)0x0) {
    pSVar6 = (Statement *)0x0;
    do {
      pSVar2 = cloneStatement(this,s_00);
      ppSVar4 = &pSVar6->nextObject;
      if (pSVar6 == (Statement *)0x0) {
        ppSVar4 = (Statement **)(__fn + 0x38);
      }
      pSVar2->nextObject = *ppSVar4;
      *ppSVar4 = pSVar2;
      s_00 = s_00->nextObject;
      pSVar6 = pSVar2;
    } while (s_00 != (Statement *)0x0);
  }
  if (*(Terminator **)((long)__child_stack + 0x40) != (Terminator *)0x0) {
    pTVar3 = cloneTerminator(this,*(Terminator **)((long)__child_stack + 0x40));
    *(Terminator **)(__fn + 0x40) = pTVar3;
    return (int)pTVar3;
  }
  throwInternalCompilerError("old.isTerminated()","clone",0x137);
}

Assistant:

void clone (heart::Block& b, const heart::Block& old)
    {
        LinkedList<heart::Statement>::Iterator last;

        for (auto p : old.parameters)
            b.parameters.push_back (cloneVariable (p));

        for (auto s : old.statements)
            last = b.statements.insertAfter (last, cloneStatement (*s));

        SOUL_ASSERT (old.isTerminated());
        b.terminator = cloneTerminator (*old.terminator);
    }